

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swift_generator.cc
# Opt level: O0

void grpc_swift_generator::anon_unknown_1::GenerateClientProtocol
               (Service *service,Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *dictonary)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  mapped_type *pmVar4;
  pointer pMVar5;
  allocator<char> local_4e9;
  key_type local_4e8;
  string local_4c8 [39];
  allocator<char> local_4a1;
  key_type local_4a0;
  string local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  string local_448;
  allocator<char> local_421;
  key_type local_420;
  string local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e0;
  string local_3c8;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_3a8;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method_2;
  int it_2;
  allocator<char> local_371;
  key_type local_370;
  string local_350 [39];
  allocator<char> local_329;
  key_type local_328;
  string local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  string local_2d0;
  allocator<char> local_2a9;
  key_type local_2a8;
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_250;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_230;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method_1;
  int it_1;
  allocator<char> local_1f9;
  key_type local_1f8;
  allocator<char> local_1d1;
  key_type local_1d0;
  string local_1b0 [39];
  allocator<char> local_189;
  key_type local_188;
  string local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_130;
  allocator<char> local_109;
  key_type local_108;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_90;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method;
  int it;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *dictonary_local;
  Printer *printer_local;
  Service *service_local;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)dictonary;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50,dictonary);
  (*printer->_vptr_Printer[2])
            (printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_50,
             "$ACCESS$ protocol $ServiceQualifiedName$ClientProtocol: GRPCClient {");
  (*printer->_vptr_Printer[3])(printer,"\n\n");
  (*printer->_vptr_Printer[3])(printer,"  var serviceName: String { get }");
  (*printer->_vptr_Printer[3])(printer,"\n\n");
  (*printer->_vptr_Printer[2])
            (printer,local_50,
             "  var interceptors: $ServiceQualifiedName$ClientInterceptorFactoryProtocol? { get }");
  (*printer->_vptr_Printer[3])(printer,"\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&it,"GenAccess",
             (allocator<char> *)
             ((long)&method._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,(key_type *)&it);
  std::__cxx11::string::operator=((string *)pmVar4,"");
  std::__cxx11::string::~string((string *)&it);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&method._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  method._M_t.
  super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
  .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ = 0;
  while( true ) {
    uVar3 = (uint)method._M_t.
                  super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                  .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl;
    iVar2 = (*(service->super_CommentHolder)._vptr_CommentHolder[8])();
    if (iVar2 <= (int)uVar3) break;
    (*(service->super_CommentHolder)._vptr_CommentHolder[9])
              (&local_90,service,
               (ulong)(uint)method._M_t.
                            super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                            .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>.
                            _M_head_impl);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_90);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[10])(&local_c8);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_90);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xb])(&local_e8);
    GenerateMessage(&local_b0,&local_c8,&local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Input",&local_109);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_108);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_90);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xc])(&local_148);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_90);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xd])(&local_168);
    GenerateMessage(&local_130,&local_148,&local_168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Output",&local_189);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_188);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_148);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_90);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[5])(local_1b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"MethodName",&local_1d1)
    ;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_1d0);
    std::__cxx11::string::operator=((string *)pmVar4,local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"isNil",&local_1f9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_1f8);
    std::__cxx11::string::operator=((string *)pmVar4,"");
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::get(&local_90);
    GenerateClientFuncName
              (pMVar5,printer,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_50);
    (*printer->_vptr_Printer[3])(printer,"\n\n");
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_90);
    method._M_t.
    super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
    .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ =
         (uint)method._M_t.
               super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
               .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 1;
  }
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])(printer,local_50,"extension $ServiceQualifiedName$ClientProtocol {");
  (*printer->_vptr_Printer[3])(printer,"\n\n");
  (*printer->_vptr_Printer[2])
            (printer,local_50,"  $ACCESS$ var serviceName: String { \"$PATH$$ServiceName$\" }\n");
  uVar3 = (*(service->super_CommentHolder)._vptr_CommentHolder[7])();
  pcVar1 = "  public ";
  if ((uVar3 & 1) != 0) {
    pcVar1 = "  internal ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&it_1,"GenAccess",
             (allocator<char> *)
             ((long)&method_1._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,(key_type *)&it_1);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar1 + 2);
  std::__cxx11::string::~string((string *)&it_1);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&method_1._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  method_1._M_t.
  super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
  .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ = 0;
  while( true ) {
    uVar3 = (uint)method_1._M_t.
                  super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                  .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl;
    iVar2 = (*(service->super_CommentHolder)._vptr_CommentHolder[8])();
    if (iVar2 <= (int)uVar3) break;
    (*(service->super_CommentHolder)._vptr_CommentHolder[9])
              (&local_230,service,
               (ulong)(uint)method_1._M_t.
                            super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                            .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>.
                            _M_head_impl);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_230);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[10])(&local_268);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_230);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xb])(&local_288);
    GenerateMessage(&local_250,&local_268,&local_288);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Input",&local_2a9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_2a8);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_288);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_230);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xc])(&local_2e8);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_230);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xd])(&local_308);
    GenerateMessage(&local_2d0,&local_2e8,&local_308);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"Output",&local_329);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_328);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_308);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e8);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_230);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[5])(local_350);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"MethodName",&local_371)
    ;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_370);
    std::__cxx11::string::operator=((string *)pmVar4,local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    std::__cxx11::string::~string(local_350);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&it_2,"isNil",
               (allocator<char> *)
               ((long)&method_2._M_t.
                       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl +
               7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,(key_type *)&it_2);
    std::__cxx11::string::operator=((string *)pmVar4," = nil");
    std::__cxx11::string::~string((string *)&it_2);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&method_2._M_t.
                       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl +
               7));
    (*printer->_vptr_Printer[3])(printer,"\n");
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::get(&local_230);
    GenerateClientFuncName
              (pMVar5,printer,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_50);
    (*printer->_vptr_Printer[3])(printer," {\n");
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::get(&local_230);
    GenerateClientFuncBody
              (pMVar5,printer,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_50);
    (*printer->_vptr_Printer[3])(printer,"  }\n");
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_230);
    method_1._M_t.
    super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
    .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ =
         (uint)method_1._M_t.
               super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
               .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 1;
  }
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])
            (printer,local_50,
             "$ACCESS$ protocol $ServiceQualifiedName$ClientInterceptorFactoryProtocol {\n");
  method_2._M_t.
  super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
  .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ = 0;
  while( true ) {
    uVar3 = (uint)method_2._M_t.
                  super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                  .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl;
    iVar2 = (*(service->super_CommentHolder)._vptr_CommentHolder[8])();
    if (iVar2 <= (int)uVar3) break;
    (*(service->super_CommentHolder)._vptr_CommentHolder[9])
              (&local_3a8,service,
               (ulong)(uint)method_2._M_t.
                            super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                            .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>.
                            _M_head_impl);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_3a8);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[10])(&local_3e0);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_3a8);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xb])(&local_400);
    GenerateMessage(&local_3c8,&local_3e0,&local_400);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"Input",&local_421);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_420);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3e0);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_3a8);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xc])(&local_460);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_3a8);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xd])(&local_480);
    GenerateMessage(&local_448,&local_460,&local_480);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"Output",&local_4a1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_4a0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_480);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_460);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_3a8);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[5])(local_4c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"MethodName",&local_4e9)
    ;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_4e8);
    std::__cxx11::string::operator=((string *)pmVar4,local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::~string(local_4c8);
    (*printer->_vptr_Printer[2])
              (printer,local_50,
               "  /// - Returns: Interceptors to use when invoking \'$MethodName$\'.\n");
    (*printer->_vptr_Printer[2])
              (printer,local_50,
               "  func make$MethodName$Interceptors() -> [ClientInterceptor<$Input$, $Output$>]\n\n"
              );
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_3a8);
    method_2._M_t.
    super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
    .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ =
         (uint)method_2._M_t.
               super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
               .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 1;
  }
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void GenerateClientProtocol(const grpc_generator::Service *service,
                            grpc_generator::Printer *printer,
                            std::map<grpc::string, grpc::string> *dictonary) {
  auto vars = *dictonary;
  printer->Print(
      vars,
      "$ACCESS$ protocol $ServiceQualifiedName$ClientProtocol: GRPCClient {");
  printer->Print("\n\n");
  printer->Print("  var serviceName: String { get }");
  printer->Print("\n\n");
  printer->Print(
      vars,
      "  var interceptors: "
      "$ServiceQualifiedName$ClientInterceptorFactoryProtocol? { get }");
  printer->Print("\n\n");

  vars["GenAccess"] = "";
  for (auto it = 0; it < service->method_count(); it++) {
    auto method = service->method(it);
    vars["Input"] = GenerateMessage(method->get_input_namespace_parts(),
                                    method->get_input_type_name());
    vars["Output"] = GenerateMessage(method->get_output_namespace_parts(),
                                     method->get_output_type_name());
    vars["MethodName"] = method->name();
    vars["isNil"] = "";
    GenerateClientFuncName(method.get(), &*printer, &vars);
    printer->Print("\n\n");
  }
  printer->Print("}\n\n");

  printer->Print(vars, "extension $ServiceQualifiedName$ClientProtocol {");
  printer->Print("\n\n");
  printer->Print(vars,
                 "  $ACCESS$ var serviceName: String { "
                 "\"$PATH$$ServiceName$\" }\n");

  vars["GenAccess"] = service->is_internal() ? "internal " : "public ";
  for (auto it = 0; it < service->method_count(); it++) {
    auto method = service->method(it);
    vars["Input"] = GenerateMessage(method->get_input_namespace_parts(),
                                    method->get_input_type_name());
    vars["Output"] = GenerateMessage(method->get_output_namespace_parts(),
                                     method->get_output_type_name());
    vars["MethodName"] = method->name();
    vars["isNil"] = " = nil";
    printer->Print("\n");
    GenerateClientFuncName(method.get(), &*printer, &vars);
    printer->Print(" {\n");
    GenerateClientFuncBody(method.get(), &*printer, &vars);
    printer->Print("  }\n");
  }
  printer->Print("}\n\n");

  printer->Print(vars,
                 "$ACCESS$ protocol "
                 "$ServiceQualifiedName$ClientInterceptorFactoryProtocol {\n");

  for (auto it = 0; it < service->method_count(); it++) {
    auto method = service->method(it);
    vars["Input"] = GenerateMessage(method->get_input_namespace_parts(),
                                    method->get_input_type_name());
    vars["Output"] = GenerateMessage(method->get_output_namespace_parts(),
                                     method->get_output_type_name());
    vars["MethodName"] = method->name();
    printer->Print(
        vars,
        "  /// - Returns: Interceptors to use when invoking '$MethodName$'.\n");
    printer->Print(vars,
                   "  func make$MethodName$Interceptors() -> "
                   "[ClientInterceptor<$Input$, $Output$>]\n\n");
  }
  printer->Print("}\n\n");
}